

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O0

void __thiscall StringBuffer::appendBuffer(StringBuffer *this,char *buffer,long length)

{
  char cVar1;
  long lVar2;
  void *pvVar3;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  char *in_RSI;
  long *in_RDI;
  long pl;
  long addThis;
  size_t local_38;
  size_t local_20;
  
  local_38 = CONCAT71(in_register_00000011,in_DL);
  if ((long)local_38 < 1) {
    local_38 = strlen(in_RSI);
  }
  if (0 < (long)local_38) {
    if ((ulong)in_RDI[2] < in_RDI[1] + local_38) {
      local_20 = (ulong)in_RDI[2] >> 3;
      if ((long)local_20 < sbDefaultBoost) {
        local_20 = sbDefaultBoost;
      }
      if ((long)local_20 < (long)local_38) {
        local_20 = local_38;
      }
      in_RDI[2] = local_20 + in_RDI[2];
      pvVar3 = realloc((void *)*in_RDI,in_RDI[2] + 1);
      *in_RDI = (long)pvVar3;
    }
    for (local_20 = 0; (long)local_20 < (long)local_38; local_20 = local_20 + 1) {
      cVar1 = in_RSI[local_20];
      lVar2 = in_RDI[1];
      in_RDI[1] = lVar2 + 1;
      *(char *)(*in_RDI + lVar2) = cVar1;
    }
    *(undefined1 *)(*in_RDI + in_RDI[1]) = 0;
  }
  return;
}

Assistant:

void StringBuffer::appendBuffer(const char *buffer, const long length) {
  long addThis, pl = length > 0 ? length : strlen(buffer);

  if (pl > 0) {
    if (saLength < sLength + pl) {
      addThis = saLength / 8;

      if (StringBuffer::sbDefaultBoost > addThis)
        addThis = StringBuffer::sbDefaultBoost;
      if (addThis < pl)
        addThis = pl;

      saLength += addThis;
      sData = (char *)realloc(sData, sizeof(char) * (saLength + 1));
    }
    for (addThis = 0; addThis < pl; addThis++)
      sData[sLength++] = buffer[addThis];

    sData[sLength] = 0;
  }
}